

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

MemTxResult
memory_region_dispatch_write_m68k
          (uc_struct_conflict3 *uc,MemoryRegion *mr,hwaddr addr,uint64_t data,MemOp_conflict op,
          MemTxAttrs attrs)

{
  int iVar1;
  device_endian dVar2;
  MemoryRegionOps *pMVar3;
  _Bool _Var4;
  MemTxResult MVar5;
  ulong uVar6;
  hwaddr hVar7;
  uint size;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  MemTxAttrs in_stack_ffffffffffffff88;
  
  size = 1 << (sbyte)(op & MO_64);
  _Var4 = memory_region_access_valid_m68k(uc,mr,addr,size,true,attrs);
  uVar12 = 2;
  if (_Var4) {
    pMVar3 = mr->ops;
    dVar2 = pMVar3->endianness;
    if ((op & MO_BE) != (uint)(dVar2 != DEVICE_LITTLE_ENDIAN) * 8) {
      switch(op & MO_64) {
      case MO_16:
        data = (uint64_t)(ushort)((ushort)data << 8 | (ushort)data >> 8);
        break;
      case MO_32:
        uVar12 = (uint)data;
        data = (uint64_t)
               (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)
        ;
        break;
      case MO_64:
        data = data >> 0x38 | (data & 0xff000000000000) >> 0x28 | (data & 0xff0000000000) >> 0x18 |
               (data & 0xff00000000) >> 8 | (data & 0xff000000) << 8 | (data & 0xff0000) << 0x18 |
               (data & 0xff00) << 0x28 | data << 0x38;
      }
    }
    uVar12 = (pMVar3->impl).max_access_size;
    uVar8 = 4;
    if (uVar12 != 0) {
      uVar8 = uVar12;
    }
    uVar12 = (pMVar3->impl).min_access_size;
    if (size <= uVar8) {
      uVar8 = size;
    }
    if (uVar8 < uVar12) {
      uVar8 = uVar12;
    }
    uVar8 = uVar8 + (uVar8 == 0);
    iVar1 = uVar8 * 8;
    uVar9 = 0xffffffffffffffff >> (-(char)iVar1 & 0x3fU);
    if (pMVar3->write == (_func_void_uc_struct_ptr_void_ptr_hwaddr_uint64_t_uint_conflict15 *)0x0) {
      if (dVar2 == DEVICE_LITTLE_ENDIAN) {
        iVar10 = 0;
        uVar12 = 0;
        uVar14 = 0;
        do {
          MVar5 = (*mr->ops->write_with_attrs)
                            ((uc_struct_conflict15 *)uc,mr->opaque,uVar14 + addr,
                             data >> ((byte)iVar10 & 0x3f) & uVar9,uVar8,in_stack_ffffffffffffff88);
          uVar12 = uVar12 | MVar5;
          uVar13 = (int)uVar14 + uVar8;
          uVar14 = (ulong)uVar13;
          iVar10 = iVar10 + iVar1;
        } while (uVar13 < size);
      }
      else {
        iVar10 = size * -8;
        iVar11 = size * 8 + uVar8 * -8;
        uVar12 = 0;
        uVar14 = 0;
        do {
          iVar10 = iVar1 + iVar10;
          hVar7 = uVar14 + addr;
          uVar13 = (int)uVar14 + uVar8;
          uVar14 = (ulong)uVar13;
          uVar6 = data << ((byte)iVar10 & 0x3f);
          if (-1 < iVar11) {
            uVar6 = data >> ((byte)iVar11 & 0x3f);
          }
          MVar5 = (*mr->ops->write_with_attrs)
                            ((uc_struct_conflict15 *)uc,mr->opaque,hVar7,uVar6 & uVar9,uVar8,
                             in_stack_ffffffffffffff88);
          uVar12 = uVar12 | MVar5;
          iVar11 = iVar11 + uVar8 * -8;
        } while (uVar13 < size);
      }
    }
    else if (dVar2 == DEVICE_LITTLE_ENDIAN) {
      uVar12 = 0;
      iVar10 = 0;
      uVar14 = 0;
      do {
        (*mr->ops->write)((uc_struct_conflict15 *)uc,mr->opaque,uVar14 + addr,
                          data >> ((byte)iVar10 & 0x3f) & uVar9,uVar8);
        uVar13 = (int)uVar14 + uVar8;
        uVar14 = (ulong)uVar13;
        iVar10 = iVar10 + iVar1;
      } while (uVar13 < size);
    }
    else {
      iVar10 = size * -8;
      iVar11 = size * 8 + uVar8 * -8;
      uVar12 = 0;
      uVar14 = 0;
      do {
        iVar10 = iVar1 + iVar10;
        hVar7 = uVar14 + addr;
        uVar13 = (int)uVar14 + uVar8;
        uVar14 = (ulong)uVar13;
        uVar6 = data << ((byte)iVar10 & 0x3f);
        if (-1 < iVar11) {
          uVar6 = data >> ((byte)iVar11 & 0x3f);
        }
        (*mr->ops->write)((uc_struct_conflict15 *)uc,mr->opaque,hVar7,uVar6 & uVar9,uVar8);
        iVar11 = iVar11 + uVar8 * -8;
      } while (uVar13 < size);
    }
  }
  return uVar12;
}

Assistant:

MemTxResult memory_region_dispatch_write(struct uc_struct *uc, MemoryRegion *mr,
                                         hwaddr addr,
                                         uint64_t data,
                                         MemOp op,
                                         MemTxAttrs attrs)
{
    unsigned size = memop_size(op);

    if (!memory_region_access_valid(uc, mr, addr, size, true, attrs)) {
        unassigned_mem_write(mr, addr, data, size);
        return MEMTX_DECODE_ERROR;
    }

    adjust_endianness(mr, &data, op);

    if (mr->ops->write) {
        return access_with_adjusted_size(uc, addr, &data, size,
                                         mr->ops->impl.min_access_size,
                                         mr->ops->impl.max_access_size,
                                         memory_region_write_accessor, mr,
                                         attrs);
    } else {
        return
            access_with_adjusted_size(uc, addr, &data, size,
                                      mr->ops->impl.min_access_size,
                                      mr->ops->impl.max_access_size,
                                      memory_region_write_with_attrs_accessor,
                                      mr, attrs);
    }
}